

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O1

void presolve::dev_kkt_check::checkPrimalFeasMatrix(State *state,KktConditionDetails *details)

{
  double dVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  details->type = kPrimalFeasibility;
  details->max_violation = 0.0;
  details->sum_violation_2 = 0.0;
  details->checked = 0;
  details->violated = 0;
  if (0 < state->numRow) {
    lVar4 = 0;
    do {
      if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar4] != 0) {
        details->checked = details->checked + 1;
        dVar1 = (state->rowValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        dVar6 = (state->rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        if ((dVar1 <= dVar6) ||
           ((state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar4] <= dVar1)) {
          dVar5 = 0.0;
          if ((dVar1 < dVar6) && (1e-07 < ABS(dVar1 - dVar6))) {
            dVar5 = dVar6 - dVar1;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
            poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," infeasible: Row value=",0x17);
            poVar2 = std::ostream::_M_insert<double>(dVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  L=",4);
            poVar2 = std::ostream::_M_insert<double>
                               ((state->rowLower->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar4]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  U=",4);
            poVar2 = std::ostream::_M_insert<double>
                               ((state->rowUpper->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar4]);
            std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
            std::ostream::put((char)poVar2);
            std::ostream::flush();
          }
          dVar6 = (state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar4];
          if ((dVar6 < dVar1) && (dVar6 = dVar1 - dVar6, 1e-07 < ABS(dVar6))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
            poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," infeasible: Row value=",0x17);
            poVar2 = std::ostream::_M_insert<double>(dVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  L=",4);
            poVar2 = std::ostream::_M_insert<double>
                               ((state->rowLower->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar4]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  U=",4);
            poVar2 = std::ostream::_M_insert<double>
                               ((state->rowUpper->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar4]);
            std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
            std::ostream::put((char)poVar2);
            std::ostream::flush();
            dVar5 = dVar6;
          }
          if (0.0 < dVar5) {
            details->violated = details->violated + 1;
            details->sum_violation_2 = dVar5 * dVar5 + details->sum_violation_2;
            if (details->max_violation <= dVar5 && dVar5 != details->max_violation) {
              details->max_violation = dVar5;
            }
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < state->numRow);
  }
  if (details->violated == 0) {
    pcVar3 = "Primal feasible.\n";
    lVar4 = 0x11;
  }
  else {
    pcVar3 = "KKT check error: Primal infeasible.\n";
    lVar4 = 0x24;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar4);
  return;
}

Assistant:

void checkPrimalFeasMatrix(const State& state, KktConditionDetails& details) {
  details.type = KktCondition::kPrimalFeasibility;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;
      double rowV = state.rowValue[i];

      if (state.rowLower[i] < rowV && rowV < state.rowUpper[i]) continue;
      double infeas = 0;

      if (((rowV - state.rowLower[i]) < 0) &&
          (fabs(rowV - state.rowLower[i]) > tol)) {
        infeas = state.rowLower[i] - rowV;
        if (dev_print == 1)
          std::cout << "Row " << i << " infeasible: Row value=" << rowV
                    << "  L=" << state.rowLower[i]
                    << "  U=" << state.rowUpper[i] << std::endl;
      }

      if (((rowV - state.rowUpper[i]) > 0) &&
          (fabs(rowV - state.rowUpper[i]) > tol)) {
        infeas = rowV - state.rowUpper[i];
        if (dev_print == 1)
          std::cout << "Row " << i << " infeasible: Row value=" << rowV
                    << "  L=" << state.rowLower[i]
                    << "  U=" << state.rowUpper[i] << std::endl;
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Primal feasible.\n";
  } else {
    if (dev_print == 1) std::cout << "KKT check error: Primal infeasible.\n";
  }
}